

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

uint32_t handleQuantizeEqualSig
                   (uint32_t abssrc,uint32_t npow2,uint32_t mask,float errTol,float srcFloat)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  float in_XMM0_Da;
  float fVar4;
  float in_XMM1_Da;
  float delta1_2;
  float delta1_1;
  int bits1;
  int bits0;
  int srcbits;
  int bits1_1;
  float delta1;
  uint32_t mask2;
  float delta0;
  uint32_t alt1;
  uint32_t alt0;
  float local_24;
  uint local_1c;
  
  local_1c = in_EDI & in_EDX;
  uVar1 = in_EDI + in_ESI & in_EDX;
  local_24 = half_to_float(0);
  local_24 = in_XMM1_Da - local_24;
  if (in_XMM0_Da <= local_24) {
    local_1c = in_EDI & (in_EDX ^ (in_ESI | in_ESI >> 1));
    local_24 = half_to_float(0);
    local_24 = in_XMM1_Da - local_24;
    if (in_XMM0_Da <= local_24) {
      fVar4 = half_to_float(0);
      if (fVar4 - in_XMM1_Da < in_XMM0_Da) {
        iVar2 = countSetBits((uint16_t)uVar1);
        iVar3 = countSetBits((uint16_t)in_EDI);
        if (iVar2 < iVar3) {
          return uVar1;
        }
      }
      return in_EDI;
    }
  }
  iVar2 = countSetBits((uint16_t)local_1c);
  iVar3 = countSetBits((uint16_t)uVar1);
  if (iVar3 < iVar2) {
    fVar4 = half_to_float(0);
    if (fVar4 - in_XMM1_Da < in_XMM0_Da) {
      return uVar1;
    }
  }
  else if ((iVar3 == iVar2) && (fVar4 = half_to_float(0), fVar4 - in_XMM1_Da < local_24)) {
    return uVar1;
  }
  return local_1c;
}

Assistant:

static inline uint32_t handleQuantizeEqualSig (
    uint32_t abssrc, uint32_t npow2, uint32_t mask, float errTol, float srcFloat)
{
    // 99.99% of the time, mask is the best choice but for a very few
    // 16-bit float to 32-bit float where even though the significands
    // of the shifted tolerance we will need mask2, so have a
    // different implementation than the basic choose 2 of the larger
    // / smaller cases
    uint32_t alt0 = (abssrc & mask);
    uint32_t alt1 = ((abssrc + npow2) & mask);

    // this costs us not much extra if it works (99.99% of the
    // time) as we would compute this immediately assuming
    // the mask almost always makes the bits smaller...
    float delta0 = srcFloat - half_to_float ((uint16_t)alt0);
    if (delta0 >= errTol)
    {
        const uint32_t mask2 = (mask ^ (npow2 | (npow2 >> 1)));

        alt0 = (abssrc & mask2);
        delta0 = srcFloat - half_to_float ((uint16_t)alt0);

        // avoid a re-check against the tolerance below...
        if (delta0 >= errTol)
        {
            float delta1 = half_to_float ((uint16_t)alt1) - srcFloat;
            if (delta1 < errTol)
            {
                int bits1 = countSetBits (alt1);
                int srcbits = countSetBits (abssrc);
                if (bits1 < srcbits)
                    return alt1;
            }
            return abssrc;
        }
    }

    int bits0 = countSetBits (alt0);
    int bits1 = countSetBits (alt1);

    // bits0 is either the same as src (i.e. mask didn't mask any bits)
    // or smaller than src, so do not need to check against that
    //
    // bits1 because we add npow2 may not actually end up smaller...
    if (bits1 < bits0)
    {
        float delta1 = half_to_float ((uint16_t)alt1) - srcFloat;
        // bits1 < bits0 and if ok, just return
        if (delta1 < errTol) return alt1;
    }
    else if (bits1 == bits0)
    {
        float delta1 = half_to_float ((uint16_t)alt1) - srcFloat;
        if (delta1 < delta0) return alt1;
    }

    // bits0 < bits1 and ok or alt1 failed
    return alt0;
}